

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

FunctionCallVar * __thiscall
kratos::Generator::call
          (Generator *this,string *func_name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
          *args,bool has_return)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__args_2;
  bool bVar1;
  mapped_type *pmVar2;
  element_type *peVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar4 [16];
  format_args args_00;
  string_view format_str;
  undefined1 local_110 [8];
  undefined1 local_108 [8];
  shared_ptr<kratos::FunctionCallVar> p;
  mapped_type func_def;
  string local_d8;
  _Self local_b8;
  _Self local_b0;
  undefined1 local_a1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  *pmStack_a0;
  bool has_return_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  *args_local;
  string *func_name_local;
  Generator *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_a1 = has_return;
  pmStack_a0 = args;
  args_local = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                *)func_name;
  func_name_local = (string *)this;
  local_b0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
       ::find(&this->funcs_,func_name);
  local_b8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
       ::end(&this->funcs_);
  bVar1 = std::operator==(&local_b0,&local_b8);
  if (!bVar1) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
             ::at(&this->funcs_,(key_type *)args_local);
    __args_2 = &p.super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
    std::shared_ptr<kratos::FunctionStmtBlock>::shared_ptr
              ((shared_ptr<kratos::FunctionStmtBlock> *)__args_2,pmVar2);
    local_110 = (undefined1  [8])this;
    std::
    make_shared<kratos::FunctionCallVar,kratos::Generator*,std::shared_ptr<kratos::FunctionStmtBlock>&,std::map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>const&,bool&>
              ((Generator **)local_108,(shared_ptr<kratos::FunctionStmtBlock> *)local_110,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                *)__args_2,(bool *)pmStack_a0);
    std::
    set<std::shared_ptr<kratos::FunctionCallVar>,std::less<std::shared_ptr<kratos::FunctionCallVar>>,std::allocator<std::shared_ptr<kratos::FunctionCallVar>>>
    ::emplace<std::shared_ptr<kratos::FunctionCallVar>&>
              ((set<std::shared_ptr<kratos::FunctionCallVar>,std::less<std::shared_ptr<kratos::FunctionCallVar>>,std::allocator<std::shared_ptr<kratos::FunctionCallVar>>>
                *)&this->calls_,(shared_ptr<kratos::FunctionCallVar> *)local_108);
    peVar3 = std::
             __shared_ptr_access<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_108);
    std::shared_ptr<kratos::FunctionCallVar>::~shared_ptr
              ((shared_ptr<kratos::FunctionCallVar> *)local_108);
    std::shared_ptr<kratos::FunctionStmtBlock>::~shared_ptr
              ((shared_ptr<kratos::FunctionStmtBlock> *)
               &p.super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return peVar3;
  }
  auVar4 = __cxa_allocate_exception(0x10);
  local_38 = &local_d8;
  local_40 = "function {0} not found";
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)args_local;
  local_68.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<std::__cxx11::string_const&,char[23],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)"function {0} not found",(v7 *)args_local,auVar4._8_8_,
                  (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)
                  "function {0} not found");
  local_50 = &local_68;
  local_78 = fmt::v7::to_string_view<char,_0>(local_40);
  local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&this_local;
  local_30 = local_50;
  local_20 = local_50;
  local_10 = local_50;
  local_18 = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_50->string);
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_80.values_;
  format_str.size_ = (size_t)this_local;
  format_str.data_ = (char *)local_78.size_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_d8,(detail *)local_78.data_,format_str,args_00);
  UserException::UserException(auVar4._0_8_,&local_d8);
  __cxa_throw(auVar4._0_8_,&UserException::typeinfo,UserException::~UserException);
}

Assistant:

FunctionCallVar &Generator::call(const std::string &func_name,
                                 const std::map<std::string, std::shared_ptr<Var>> &args,
                                 bool has_return) {
    if (funcs_.find(func_name) == funcs_.end())
        throw UserException(::format("function {0} not found", func_name));
    auto func_def = funcs_.at(func_name);
    auto p = std::make_shared<FunctionCallVar>(this, func_def, args, has_return);
    calls_.emplace(p);
    return *p;
}